

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataPdu.cpp
# Opt level: O2

int __thiscall DIS::DataPdu::getMarshalledSize(DataPdu *this)

{
  pointer pFVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  FixedDatum listElement;
  
  iVar3 = SimulationManagementFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementFamilyPdu);
  iVar3 = iVar3 + 0x10;
  lVar6 = 8;
  for (uVar5 = 0;
      pFVar1 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_fixedDatums).
                            super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar5 = uVar5 + 1) {
    listElement._vptr_FixedDatum = (_func_int **)&PTR__FixedDatum_001c1c68;
    listElement._8_8_ = *(undefined8 *)((long)&pFVar1->_vptr_FixedDatum + lVar6);
    iVar4 = FixedDatum::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar4;
    FixedDatum::~FixedDatum(&listElement);
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 0;
  for (uVar5 = 0;
      pVVar2 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->_variableDatums).
                             super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x30);
      uVar5 = uVar5 + 1) {
    VariableDatum::VariableDatum
              ((VariableDatum *)&listElement,
               (VariableDatum *)((long)&pVVar2->_vptr_VariableDatum + lVar6));
    iVar4 = VariableDatum::getMarshalledSize((VariableDatum *)&listElement);
    iVar3 = iVar3 + iVar4;
    VariableDatum::~VariableDatum((VariableDatum *)&listElement);
    lVar6 = lVar6 + 0x30;
  }
  return iVar3;
}

Assistant:

int DataPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 4;  // _padding1
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatums.size(); idx++)
   {
        FixedDatum listElement = _fixedDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatums.size(); idx++)
   {
        VariableDatum listElement = _variableDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}